

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O2

void mnf::ExpMapMatrix::applyDiffPseudoLog0_
               (RefMat *out,ConstRefMat *in,ConstRefVec *x,ReusableTemporaryMap *m)

{
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> *local_138;
  Product<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>
  local_130;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> a;
  MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> local_100 [216];
  
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 3) {
    ReusableTemporaryMap::getMap
              (&a,m,(in->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value,9);
    diffPseudoLog0_((Matrix<double,_3,_9,_0,_3,_9> *)local_100,x);
    local_130 = Eigen::
                MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>>
                ::operator*((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>>
                             *)in,local_100);
    local_138 = &a;
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,16,Eigen::Stride<0,0>>,Eigen::MatrixBase>
    ::operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,16,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                 *)&local_138,
                (MatrixBase<Eigen::Product<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
                 *)&local_130);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,16,Eigen::Stride<0,0>>>
              (out,&a);
    return;
  }
  __assert_fail("in.cols() == InputDim_ && \"Dimensions mismatch\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/ExpMapMatrix.cpp"
                ,0xf5,
                "static void mnf::ExpMapMatrix::applyDiffPseudoLog0_(RefMat, const ConstRefMat &, const ConstRefVec &, ReusableTemporaryMap &)"
               );
}

Assistant:

void ExpMapMatrix::applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                        const ConstRefVec& x,
                                        ReusableTemporaryMap& m)
{
  mnf_assert(in.cols() == InputDim_ && "Dimensions mismatch");
  Eigen::Map<Eigen::MatrixXd, Eigen::Aligned> a =
      m.getMap(in.rows(), OutputDim_);
  a.noalias() = in * diffPseudoLog0_(x);
  out = a;
}